

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test_utils.hpp
# Opt level: O1

void __thiscall
unodb::test::
tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::
insert_key_range_internal
          (tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this,key_type start_key,size_t count,bool bypass_verifier)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  key_type key;
  undefined1 *puVar3;
  long lVar4;
  value_view v;
  
  if (start_key < count + start_key) {
    puVar3 = test_values + start_key * 0x10;
    lVar4 = start_key * 0x10 + 0x259868;
    do {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = start_key;
      uVar2 = SUB168(auVar1 * ZEXT816(0xaaaaaaaaaaaaaaab),8) & 0x1ffffffffffffffc;
      v._M_extent._M_extent_value = *(size_t *)(lVar4 + uVar2 * -0x18);
      v._M_ptr = *(pointer *)(puVar3 + uVar2 * -0x18);
      insert_internal(this,start_key,v,bypass_verifier);
      start_key = start_key + 1;
      puVar3 = puVar3 + 0x10;
      lVar4 = lVar4 + 0x10;
      count = count - 1;
    } while (count != 0);
  }
  return;
}

Assistant:

void insert_key_range_internal(key_type start_key, std::size_t count,
                                 bool bypass_verifier = false) {
    if constexpr (std::is_same_v<key_type, key_view>) {
      // decode to figure out the start key for the loop.
      unodb::key_decoder dec(start_key);
      std::uint64_t start_key_dec;
      dec.decode(start_key_dec);
      unodb::key_encoder enc;
      for (auto key = start_key_dec; key < start_key_dec + count; ++key) {
        insert(enc.reset().encode(key).get_key_view(),
               test_values[key % test_values.size()], bypass_verifier);
      }
    } else {
      for (auto key = start_key; key < start_key + count; ++key) {
        insert(key, test_values[key % test_values.size()], bypass_verifier);
      }
    }
  }